

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout_json.c
# Opt level: O0

void jsonWriteString(FILE *stream,char *in,_Bool lowercase)

{
  int iVar1;
  size_t len;
  size_t sVar2;
  char *__s;
  undefined1 local_40 [8];
  dynbuf out;
  _Bool lowercase_local;
  char *in_local;
  FILE *stream_local;
  
  out.toobig._7_1_ = lowercase;
  curlx_dyn_init((dynbuf *)local_40,100000);
  len = strlen(in);
  iVar1 = jsonquoted(in,len,(dynbuf *)local_40,(_Bool)(out.toobig._7_1_ & 1));
  if (iVar1 == 0) {
    fputc(0x22,(FILE *)stream);
    sVar2 = curlx_dyn_len((dynbuf *)local_40);
    if (sVar2 != 0) {
      __s = curlx_dyn_ptr((dynbuf *)local_40);
      fputs(__s,(FILE *)stream);
    }
    fputc(0x22,(FILE *)stream);
  }
  curlx_dyn_free((dynbuf *)local_40);
  return;
}

Assistant:

void jsonWriteString(FILE *stream, const char *in, bool lowercase)
{
  struct curlx_dynbuf out;
  curlx_dyn_init(&out, MAX_JSON_STRING);

  if(!jsonquoted(in, strlen(in), &out, lowercase)) {
    fputc('\"', stream);
    if(curlx_dyn_len(&out))
      fputs(curlx_dyn_ptr(&out), stream);
    fputc('\"', stream);
  }
  curlx_dyn_free(&out);
}